

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O2

int SHA1_Final(SHA1_CTX *context,uint8_t *digest)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  uint8_t c;
  undefined1 local_30 [8];
  
  bVar1 = 0;
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    bVar5 = ~bVar1;
    bVar1 = bVar1 + 8;
    local_30[uVar3] = (char)(context->count[uVar3 < 4] >> (bVar5 & 0x18));
  }
  c = 0x80;
  SHA1_Update((SHA_CTX *)context,&c,1);
  while ((context->count[0] & 0x1f8) != 0x1c0) {
    c = '\0';
    SHA1_Update((SHA_CTX *)context,&c,1);
  }
  SHA1_Update((SHA_CTX *)context,local_30,8);
  iVar2 = 0;
  for (lVar4 = 0; lVar4 != 0x14; lVar4 = lVar4 + 1) {
    digest[lVar4] =
         (uint8_t)(*(uint *)((long)context->state + (ulong)((uint)lVar4 & 0xfffffffc)) >>
                  (~(byte)iVar2 & 0x18));
    iVar2 = iVar2 + 8;
  }
  context->buffer[0] = '\0';
  context->buffer[1] = '\0';
  context->buffer[2] = '\0';
  context->buffer[3] = '\0';
  context->buffer[4] = '\0';
  context->buffer[5] = '\0';
  context->buffer[6] = '\0';
  context->buffer[7] = '\0';
  context->buffer[8] = '\0';
  context->buffer[9] = '\0';
  context->buffer[10] = '\0';
  context->buffer[0xb] = '\0';
  context->buffer[0xc] = '\0';
  context->buffer[0xd] = '\0';
  context->buffer[0xe] = '\0';
  context->buffer[0xf] = '\0';
  context->buffer[0x10] = '\0';
  context->buffer[0x11] = '\0';
  context->buffer[0x12] = '\0';
  context->buffer[0x13] = '\0';
  context->buffer[0x14] = '\0';
  context->buffer[0x15] = '\0';
  context->buffer[0x16] = '\0';
  context->buffer[0x17] = '\0';
  context->buffer[0x18] = '\0';
  context->buffer[0x19] = '\0';
  context->buffer[0x1a] = '\0';
  context->buffer[0x1b] = '\0';
  context->buffer[0x1c] = '\0';
  context->buffer[0x1d] = '\0';
  context->buffer[0x1e] = '\0';
  context->buffer[0x1f] = '\0';
  context->buffer[0x20] = '\0';
  context->buffer[0x21] = '\0';
  context->buffer[0x22] = '\0';
  context->buffer[0x23] = '\0';
  context->buffer[0x24] = '\0';
  context->buffer[0x25] = '\0';
  context->buffer[0x26] = '\0';
  context->buffer[0x27] = '\0';
  context->buffer[0x28] = '\0';
  context->buffer[0x29] = '\0';
  context->buffer[0x2a] = '\0';
  context->buffer[0x2b] = '\0';
  context->buffer[0x2c] = '\0';
  context->buffer[0x2d] = '\0';
  context->buffer[0x2e] = '\0';
  context->buffer[0x2f] = '\0';
  context->buffer[0x30] = '\0';
  context->buffer[0x31] = '\0';
  context->buffer[0x32] = '\0';
  context->buffer[0x33] = '\0';
  context->buffer[0x34] = '\0';
  context->buffer[0x35] = '\0';
  context->buffer[0x36] = '\0';
  context->buffer[0x37] = '\0';
  context->buffer[0x38] = '\0';
  context->buffer[0x39] = '\0';
  context->buffer[0x3a] = '\0';
  context->buffer[0x3b] = '\0';
  context->buffer[0x3c] = '\0';
  context->buffer[0x3d] = '\0';
  context->buffer[0x3e] = '\0';
  context->buffer[0x3f] = '\0';
  context->state[0] = 0;
  context->state[1] = 0;
  context->state[2] = 0;
  context->state[3] = 0;
  *(undefined8 *)(context->state + 4) = 0;
  *(undefined8 *)(context->count + 1) = 0;
  context->buffer[4] = '\0';
  context->buffer[5] = '\0';
  context->buffer[6] = '\0';
  context->buffer[7] = '\0';
  context->buffer[8] = '\0';
  context->buffer[9] = '\0';
  context->buffer[10] = '\0';
  context->buffer[0xb] = '\0';
  context->buffer[0xc] = '\0';
  context->buffer[0xd] = '\0';
  context->buffer[0xe] = '\0';
  context->buffer[0xf] = '\0';
  context->buffer[0x10] = '\0';
  context->buffer[0x11] = '\0';
  context->buffer[0x12] = '\0';
  context->buffer[0x13] = '\0';
  context->buffer[0x14] = '\0';
  context->buffer[0x15] = '\0';
  context->buffer[0x16] = '\0';
  context->buffer[0x17] = '\0';
  context->buffer[0x18] = '\0';
  context->buffer[0x19] = '\0';
  context->buffer[0x1a] = '\0';
  context->buffer[0x1b] = '\0';
  context->buffer[0x1c] = '\0';
  context->buffer[0x1d] = '\0';
  context->buffer[0x1e] = '\0';
  context->buffer[0x1f] = '\0';
  context->buffer[0x20] = '\0';
  context->buffer[0x21] = '\0';
  context->buffer[0x22] = '\0';
  context->buffer[0x23] = '\0';
  return iVar2;
}

Assistant:

void SHA1_Final(SHA1_CTX *context, uint8_t digest[SHA1_DIGEST_SIZE]) {
  unsigned i;
  uint8_t finalcount[8];
  uint8_t c;

  for (i = 0; i < 8; i++) {
    finalcount[i] =
        /* Endian independent */
        (uint8_t)(context->count[(i >= 4 ? 0 : 1)] >> ((3 - (i & 3)) * 8));
  }
  c = 0200;
  SHA1_Update(context, &c, 1);
  while ((context->count[0] & 504) != 448) {
    c = 0000;
    SHA1_Update(context, &c, 1);
  }
  SHA1_Update(context, finalcount, 8); /* Should cause a SHA1_Transform() */
  for (i = 0; i < 20; i++) {
    digest[i] = (uint8_t)(context->state[i >> 2] >> ((3 - (i & 3)) * 8));
  }
  /* Wipe variables */
  memset(context, '\0', sizeof(*context));
  memset(&finalcount, '\0', sizeof(finalcount));
}